

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O2

int sha3_shake_memory(int num,uchar *in,unsigned_long inlen,uchar *out,unsigned_long *outlen)

{
  int iVar1;
  hash_state md;
  
  if (in == (uchar *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0x125
           );
  }
  if (out == (uchar *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0x126
           );
  }
  if (outlen == (unsigned_long *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0x127
           );
  }
  if ((num == 0x100) || (num == 0x80)) {
    md._384_8_ = 0;
    md._392_8_ = 0;
    md._400_8_ = 0;
    md._320_8_ = 0;
    md._328_8_ = 0;
    md._336_8_ = 0;
    md._344_8_ = 0;
    md._352_8_ = 0;
    md._360_8_ = 0;
    md._368_8_ = 0;
    md._376_8_ = 0;
    md._256_8_ = 0;
    md._264_8_ = 0;
    md._272_8_ = 0;
    md._280_8_ = 0;
    md._288_8_ = 0;
    md._296_8_ = 0;
    md._304_8_ = 0;
    md._312_8_ = 0;
    md.sha3.s[0x17] = 0;
    md.sha3.s[0x18] = 0;
    md._208_8_ = 0;
    md._216_8_ = 0;
    md.blake2b.curlen = 0;
    md.blake2b.outlen = 0;
    md._240_8_ = 0;
    md._248_8_ = 0;
    md.sha3.s[0xf] = 0;
    md.sha3.s[0x10] = 0;
    md.sha3.s[0x11] = 0;
    md.sha3.s[0x12] = 0;
    md.sha3.s[0x13] = 0;
    md.sha3.s[0x14] = 0;
    md.sha3.s[0x15] = 0;
    md.sha3.s[0x16] = 0;
    md.whirlpool.state[7] = 0;
    md.sha3.s[8] = 0;
    md.sha3.s[9] = 0;
    md.sha3.s[10] = 0;
    md.sha3.s[0xb] = 0;
    md.sha3.s[0xc] = 0;
    md.sha3.s[0xd] = 0;
    md.sha3.s[0xe] = 0;
    md.chc.length = 0;
    md.whirlpool.state[0] = 0;
    md.whirlpool.state[1] = 0;
    md.whirlpool.state[2] = 0;
    md.whirlpool.state[3] = 0;
    md.whirlpool.state[4] = 0;
    md.whirlpool.state[5] = 0;
    md.whirlpool.state[6] = 0;
    md._408_8_ = (ulong)(ushort)((uint)num >> 5) << 0x20;
    sha3_process(&md,in,inlen);
    sha3_shake_done(&md,out,*outlen);
    iVar1 = 0;
  }
  else {
    iVar1 = 0x10;
  }
  return iVar1;
}

Assistant:

int sha3_shake_memory(int num, const unsigned char *in, unsigned long inlen, unsigned char *out, unsigned long *outlen)
{
   hash_state md;
   int err;
   LTC_ARGCHK(in  != NULL);
   LTC_ARGCHK(out != NULL);
   LTC_ARGCHK(outlen != NULL);
   if ((err = sha3_shake_init(&md, num))          != CRYPT_OK) return err;
   if ((err = sha3_shake_process(&md, in, inlen)) != CRYPT_OK) return err;
   if ((err = sha3_shake_done(&md, out, *outlen)) != CRYPT_OK) return err;
   return CRYPT_OK;
}